

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void example2(string *fileNameIn,string *fileNameOut)

{
  size_type sVar1;
  reference pvVar2;
  size_t __n;
  void *__buf;
  vector<gdsSTR,_std::allocator<gdsSTR>_> local_288;
  allocator<char> local_269;
  string local_268;
  gdsSREF local_248;
  allocator<char> local_1c9;
  string local_1c8;
  gdsSREF local_1a8;
  undefined1 local_130 [8];
  vector<int,_std::allocator<int>_> corY;
  vector<int,_std::allocator<int>_> corX;
  undefined1 local_f0 [8];
  vector<gdsSTR,_std::allocator<gdsSTR>_> arrSTR;
  gdscpp fooGDS;
  string *fileNameOut_local;
  string *fileNameIn_local;
  
  gdscpp::gdscpp((gdscpp *)
                 &arrSTR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::vector
            ((vector<gdsSTR,_std::allocator<gdsSTR>_> *)local_f0);
  sVar1 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::size
                    ((vector<gdsSTR,_std::allocator<gdsSTR>_> *)local_f0);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::resize
            ((vector<gdsSTR,_std::allocator<gdsSTR>_> *)local_f0,sVar1 + 1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_130);
  pvVar2 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::back
                     ((vector<gdsSTR,_std::allocator<gdsSTR>_> *)local_f0);
  std::__cxx11::string::operator=((string *)pvVar2,"example2");
  pvVar2 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::back
                     ((vector<gdsSTR,_std::allocator<gdsSTR>_> *)local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"arrow_box",&local_1c9);
  drawSREF(&local_1a8,&local_1c8,0,0);
  std::vector<gdsSREF,_std::allocator<gdsSREF>_>::push_back(&pvVar2->SREF,&local_1a8);
  gdsSREF::~gdsSREF(&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  pvVar2 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::back
                     ((vector<gdsSTR,_std::allocator<gdsSTR>_> *)local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"arrow_box",&local_269);
  __n = 500;
  drawSREF(&local_248,&local_268,500,500,0.0,1.0,false);
  std::vector<gdsSREF,_std::allocator<gdsSREF>_>::push_back(&pvVar2->SREF,&local_248);
  gdsSREF::~gdsSREF(&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  gdscpp::importGDSfile
            ((gdscpp *)
             &arrSTR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,fileNameIn);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::vector
            (&local_288,(vector<gdsSTR,_std::allocator<gdsSTR>_> *)local_f0);
  gdscpp::setSTR((gdscpp *)
                 &arrSTR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_288);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::~vector(&local_288);
  gdscpp::write((gdscpp *)
                &arrSTR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(int)fileNameOut,__buf,__n);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_130);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &corY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::~vector
            ((vector<gdsSTR,_std::allocator<gdsSTR>_> *)local_f0);
  gdscpp::~gdscpp((gdscpp *)
                  &arrSTR.super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void example2(const string &fileNameIn, const string &fileNameOut)
{
  gdscpp fooGDS;
  vector<gdsSTR> arrSTR;
  arrSTR.resize(arrSTR.size() + 1);

  vector<int> corX;
  vector<int> corY;

  arrSTR.back().name = "example2";
  arrSTR.back().SREF.push_back(drawSREF("arrow_box", 0, 0));
  arrSTR.back().SREF.push_back(drawSREF("arrow_box", 500, 500, 0, 1, false));

  fooGDS.importGDSfile(fileNameIn);
  fooGDS.setSTR(arrSTR);
  fooGDS.write(fileNameOut);
}